

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialSimulationDataGenerator.cpp
# Opt level: O1

U32 __thiscall
SerialSimulationDataGenerator::GenerateSimulationData
          (SerialSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U64 value;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  uint uVar4;
  double dVar5;
  
  uVar1 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  while (uVar2 < uVar1) {
    uVar4 = (uint)&this->mSerialSimulationData;
    if (this->mSettings->mSerialMode == Normal) {
      value = this->mValue;
      this->mValue = value + 1;
      CreateSerialByte(this,value);
      dVar5 = 10.0;
    }
    else {
      CreateSerialByte(this,this->mMpModeAddressMask | 1);
      iVar3 = 4;
      do {
        ClockGenerator::AdvanceByHalfPeriod(2.0);
        SimulationChannelDescriptor::Advance(uVar4);
        uVar2 = this->mValue;
        this->mValue = uVar2 + 1;
        CreateSerialByte(this,uVar2 & this->mNumBitsMask | this->mMpModeDataMask);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      ClockGenerator::AdvanceByHalfPeriod(20.0);
      SimulationChannelDescriptor::Advance(uVar4);
      CreateSerialByte(this,this->mMpModeAddressMask | 2);
      iVar3 = 4;
      do {
        ClockGenerator::AdvanceByHalfPeriod(2.0);
        SimulationChannelDescriptor::Advance(uVar4);
        uVar2 = this->mValue;
        this->mValue = uVar2 + 1;
        CreateSerialByte(this,uVar2 & this->mNumBitsMask | this->mMpModeDataMask);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      dVar5 = 20.0;
    }
    ClockGenerator::AdvanceByHalfPeriod(dVar5);
    SimulationChannelDescriptor::Advance(uVar4);
    uVar2 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  }
  *simulation_channels = &this->mSerialSimulationData;
  return 1;
}

Assistant:

U32 SerialSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate,
                                                           SimulationChannelDescriptor** simulation_channels )
{
    U64 adjusted_largest_sample_requested =
        AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

    while( mSerialSimulationData.GetCurrentSampleNumber() < adjusted_largest_sample_requested )
    {
        if( mSettings->mSerialMode == SerialAnalyzerEnums::Normal )
        {
            CreateSerialByte( mValue++ );

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }
        else
        {
            U64 address = 0x1 | mMpModeAddressMask;
            CreateSerialByte( address );

            for( U32 i = 0; i < 4; i++ )
            {
                mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 2 bit-periods of idle
                CreateSerialByte( ( mValue++ & mNumBitsMask ) | mMpModeDataMask );
            }

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 20 bit-periods of idle

            address = 0x2 | mMpModeAddressMask;
            CreateSerialByte( address );

            for( U32 i = 0; i < 4; i++ )
            {
                mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 2.0 ) ); // insert 2 bit-periods of idle
                CreateSerialByte( ( mValue++ & mNumBitsMask ) | mMpModeDataMask );
            }

            mSerialSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 20.0 ) ); // insert 20 bit-periods of idle
        }
    }

    *simulation_channels = &mSerialSimulationData;


    return 1; // we are retuning the size of the SimulationChannelDescriptor array.  In our case, the "array" is length 1.
}